

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

FilterResult __thiscall
duckdb::FilterCombiner::AddBoundComparisonFilter(FilterCombiner *this,Expression *expr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ClientContext *context;
  iterator __position;
  Value *pVVar1;
  _Base_ptr *pp_Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FilterResult FVar7;
  FilterResult FVar8;
  BoundComparisonExpression *pBVar9;
  pointer pEVar10;
  type pEVar11;
  Expression *expr_00;
  Expression *expr_01;
  idx_t iVar12;
  idx_t iVar13;
  _Base_ptr p_Var14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  ExpressionValueInformation *right_constant;
  _Base_ptr p_Var19;
  vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
  *this_01;
  Value *other;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar20;
  FilterCombiner *pFVar21;
  FilterCombiner *this_02;
  char cVar22;
  reference_wrapper<duckdb::Expression> *right_expr;
  map<unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  *info_list;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_03;
  ExpressionValueInformation info;
  Value constant_value;
  undefined1 local_190 [72];
  Value local_148;
  ExpressionType local_108;
  Value local_100;
  undefined1 local_c0 [136];
  LogicalTypeId local_38;
  
  pBVar9 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&expr->super_BaseExpression);
  FVar8 = UNSUPPORTED;
  if ((byte)((pBVar9->super_Expression).super_BaseExpression.type - COMPARE_BOUNDARY_START) < 6) {
    this_03 = &pBVar9->left;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_03);
    iVar5 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
    this_00 = &pBVar9->right;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    iVar6 = (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar10);
    cVar22 = (char)iVar5;
    if ((cVar22 == '\0') && ((char)iVar6 == '\0')) {
      if ((expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_03);
        expr_00 = GetNode(this,pEVar11);
        pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(this_00);
        expr_01 = GetNode(this,pEVar11);
        iVar5 = (*(expr_00->super_BaseExpression)._vptr_BaseExpression[10])(expr_00,expr_01);
        FVar8 = UNSUPPORTED;
        if ((char)iVar5 == '\0') {
          iVar12 = GetEquivalenceSet(this,expr_00);
          iVar13 = GetEquivalenceSet(this,expr_01);
          FVar8 = SUCCESS;
          if (iVar12 != iVar13) {
            p_Var14 = (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var16 = &(this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var17 = p_Var16;
            p_Var18 = p_Var14;
            if (p_Var14 == (_Base_ptr)0x0) {
              this_01 = (vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                         *)&this->set_index;
            }
            else {
              do {
                p_Var19 = p_Var18 + 1;
                if (*(ulong *)p_Var19 >= iVar12) {
                  p_Var17 = p_Var18;
                }
                pp_Var2 = &p_Var18->_M_left;
                p_Var18 = pp_Var2[*(ulong *)p_Var19 < iVar12];
              } while (pp_Var2[*(ulong *)p_Var19 < iVar12] != (_Base_ptr)0x0);
              p_Var18 = p_Var16;
              p_Var19 = p_Var16;
              if ((p_Var17 != p_Var16) && (p_Var19 = p_Var17, iVar12 < *(ulong *)(p_Var17 + 1))) {
                p_Var19 = p_Var16;
              }
              do {
                if (*(ulong *)(p_Var14 + 1) >= iVar13) {
                  p_Var18 = p_Var14;
                }
                p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < iVar13];
              } while (p_Var14 != (_Base_ptr)0x0);
              this_01 = (vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                         *)&p_Var19[1]._M_parent;
              if ((p_Var18 != p_Var16) && (*(ulong *)(p_Var18 + 1) <= iVar13)) {
                p_Var16 = p_Var18;
              }
            }
            p_Var14 = p_Var16[1]._M_parent;
            p_Var16 = p_Var16[1]._M_left;
            if (p_Var14 != p_Var16) {
              do {
                pmVar15 = ::std::__detail::
                          _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&this->equivalence_set_map,(key_type *)p_Var14);
                *pmVar15 = iVar12;
                __position._M_current = *(reference_wrapper<duckdb::Expression> **)(this_01 + 8);
                if (__position._M_current ==
                    *(reference_wrapper<duckdb::Expression> **)(this_01 + 0x10)) {
                  ::std::
                  vector<std::reference_wrapper<duckdb::Expression>,std::allocator<std::reference_wrapper<duckdb::Expression>>>
                  ::_M_realloc_insert<std::reference_wrapper<duckdb::Expression>const&>
                            (this_01,__position,(reference_wrapper<duckdb::Expression> *)p_Var14);
                }
                else {
                  (__position._M_current)->_M_data = *(Expression **)p_Var14;
                  *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
                }
                p_Var14 = (_Base_ptr)&p_Var14->_M_parent;
              } while (p_Var14 != p_Var16);
            }
            p_Var14 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var16 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var17 = p_Var16;
            p_Var18 = p_Var14;
            if (p_Var14 == (_Base_ptr)0x0) {
              info_list = &this->equivalence_map;
            }
            else {
              do {
                p_Var19 = p_Var18 + 1;
                if (*(ulong *)p_Var19 >= iVar12) {
                  p_Var17 = p_Var18;
                }
                pp_Var2 = &p_Var18->_M_left;
                p_Var18 = pp_Var2[*(ulong *)p_Var19 < iVar12];
              } while (pp_Var2[*(ulong *)p_Var19 < iVar12] != (_Base_ptr)0x0);
              p_Var18 = p_Var16;
              p_Var19 = p_Var16;
              if ((p_Var17 != p_Var16) && (p_Var19 = p_Var17, iVar12 < *(ulong *)(p_Var17 + 1))) {
                p_Var19 = p_Var16;
              }
              do {
                if (*(ulong *)(p_Var14 + 1) >= iVar13) {
                  p_Var18 = p_Var14;
                }
                p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < iVar13];
              } while (p_Var14 != (_Base_ptr)0x0);
              info_list = (map<unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
                           *)&p_Var19[1]._M_parent;
              if ((p_Var18 != p_Var16) && (*(ulong *)(p_Var18 + 1) <= iVar13)) {
                p_Var16 = p_Var18;
              }
            }
            other = (Value *)p_Var16[1]._M_parent;
            pVVar1 = (Value *)p_Var16[1]._M_left;
            if (other != pVVar1) {
              pFVar21 = (FilterCombiner *)(local_c0 + 0x48);
              do {
                this_02 = pFVar21;
                Value::Value((Value *)pFVar21,other);
                local_38 = other[1].type_.id_;
                FVar8 = AddConstantComparison
                                  (this_02,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                            *)info_list,(ExpressionValueInformation *)pFVar21);
                Value::~Value((Value *)pFVar21);
                if (FVar8 == UNSATISFIABLE) {
                  return UNSATISFIABLE;
                }
                other = (Value *)&other[1].type_.type_info_;
              } while (other != pVVar1);
            }
            FVar8 = SUCCESS;
          }
        }
      }
      else {
        FVar8 = UNSUPPORTED;
      }
    }
    else {
      puVar20 = this_03;
      if (cVar22 != '\0') {
        puVar20 = this_00;
      }
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar20);
      local_190._32_8_ = GetNode(this,pEVar11);
      local_190._40_8_ = GetEquivalenceSet(this,(Expression *)local_190._32_8_);
      LogicalType::LogicalType((LogicalType *)(local_190 + 0x30),SQLNULL);
      Value::Value(&local_100,(LogicalType *)(local_190 + 0x30));
      puVar20 = this_00;
      if (cVar22 != '\0') {
        puVar20 = this_03;
      }
      local_190._24_8_ = this_00;
      LogicalType::~LogicalType((LogicalType *)(local_190 + 0x30));
      context = this->context;
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar20);
      bVar4 = ExpressionExecutor::TryEvaluateScalar(context,pEVar11,&local_100);
      FVar8 = UNSUPPORTED;
      if ((bVar4) && (FVar8 = UNSATISFIABLE, local_100.is_null == false)) {
        LogicalType::LogicalType((LogicalType *)local_190,SQLNULL);
        Value::Value(&local_148,(LogicalType *)local_190);
        uVar3 = local_190._40_8_;
        LogicalType::~LogicalType((LogicalType *)local_190);
        local_108 = (pBVar9->super_Expression).super_BaseExpression.type;
        if (cVar22 != '\0') {
          local_108 = FlipComparisonExpression(local_108);
        }
        Value::operator=(&local_148,&local_100);
        p_Var14 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var17 = p_Var16;
        if (p_Var14 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var14 + 1) >= (ulong)uVar3) {
              p_Var17 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < (ulong)uVar3];
          } while (p_Var14 != (_Base_ptr)0x0);
          if ((p_Var17 != p_Var16) && (*(ulong *)(p_Var17 + 1) <= (ulong)uVar3)) {
            p_Var16 = p_Var17;
          }
        }
        bVar4 = LogicalType::operator==((LogicalType *)(local_190._32_8_ + 0x38),&local_148.type_);
        FVar8 = UNSUPPORTED;
        if (bVar4) {
          pFVar21 = (FilterCombiner *)local_c0;
          Value::Value((Value *)pFVar21,&local_148);
          local_c0[0x40] = local_108;
          FVar8 = AddConstantComparison
                            (pFVar21,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                      *)&p_Var16[1]._M_parent,(ExpressionValueInformation *)local_c0
                            );
          Value::~Value((Value *)local_c0);
          if (cVar22 != '\0') {
            this_03 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_190._24_8_;
          }
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                    (this_03);
          FindTransitiveFilter((FilterCombiner *)local_190,(Expression *)this);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_190._0_8_ != (Expression *)0x0) {
            pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_190);
            pBVar9 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                               (&pEVar10->super_BaseExpression);
            FVar7 = AddTransitiveFilters(this,pBVar9,true);
            if (FVar7 == UNSATISFIABLE) {
              FVar8 = UNSATISFIABLE;
            }
            else if (FVar7 == UNSUPPORTED) {
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&this->remaining_filters,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_190);
            }
          }
          if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_190._0_8_ !=
              (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
            (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((BaseExpression *)local_190._0_8_)->_vptr_BaseExpression)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
        }
        Value::~Value(&local_148);
      }
      Value::~Value(&local_100);
    }
  }
  return FVar8;
}

Assistant:

FilterResult FilterCombiner::AddBoundComparisonFilter(Expression &expr) {
	auto &comparison = expr.Cast<BoundComparisonExpression>();
	if (!SupportedFilterComparison(comparison.GetExpressionType())) {
		// only support [>, >=, <, <=, ==, !=] expressions
		return FilterResult::UNSUPPORTED;
	}
	// check if one of the sides is a scalar value
	bool left_is_scalar = comparison.left->IsFoldable();
	bool right_is_scalar = comparison.right->IsFoldable();
	if (left_is_scalar || right_is_scalar) {
		// comparison with scalar
		auto &node = GetNode(left_is_scalar ? *comparison.right : *comparison.left);
		idx_t equivalence_set = GetEquivalenceSet(node);
		auto &scalar = left_is_scalar ? comparison.left : comparison.right;
		Value constant_value;
		if (!ExpressionExecutor::TryEvaluateScalar(context, *scalar, constant_value)) {
			return FilterResult::UNSUPPORTED;
		}
		if (constant_value.IsNull()) {
			// comparisons with null are always null (i.e. will never result in rows)
			return FilterResult::UNSATISFIABLE;
		}

		// create the ExpressionValueInformation
		ExpressionValueInformation info;
		info.comparison_type =
		    left_is_scalar ? FlipComparisonExpression(comparison.GetExpressionType()) : comparison.GetExpressionType();
		info.constant = constant_value;

		// get the current bucket of constant values
		D_ASSERT(constant_values.find(equivalence_set) != constant_values.end());
		auto &info_list = constant_values.find(equivalence_set)->second;
		if (node.return_type != info.constant.type()) {
			return FilterResult::UNSUPPORTED;
		}
		// check the existing constant comparisons to see if we can do any pruning
		auto ret = AddConstantComparison(info_list, info);

		auto &non_scalar = left_is_scalar ? *comparison.right : *comparison.left;
		auto transitive_filter = FindTransitiveFilter(non_scalar);
		if (transitive_filter != nullptr) {
			// try to add transitive filters
			auto transitive_result = AddTransitiveFilters(transitive_filter->Cast<BoundComparisonExpression>());
			if (transitive_result == FilterResult::UNSUPPORTED) {
				// in case of unsuccessful re-add filter into remaining ones
				remaining_filters.push_back(std::move(transitive_filter));
			}
			if (transitive_result == FilterResult::UNSATISFIABLE) {
				// in case transitive filter is unsatisfiable - abort filter pushdown
				return FilterResult::UNSATISFIABLE;
			}
		}
		return ret;
	} else {
		// comparison between two non-scalars
		// only handle comparisons for now
		if (expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
			return FilterResult::UNSUPPORTED;
		}
		// get the LHS and RHS nodes
		auto &left_node = GetNode(*comparison.left);
		auto &right_node = GetNode(*comparison.right);
		if (left_node.Equals(right_node)) {
			return FilterResult::UNSUPPORTED;
		}
		// get the equivalence sets of the LHS and RHS
		auto left_equivalence_set = GetEquivalenceSet(left_node);
		auto right_equivalence_set = GetEquivalenceSet(right_node);
		if (left_equivalence_set == right_equivalence_set) {
			// this equality filter already exists, prune it
			return FilterResult::SUCCESS;
		}
		// add the right bucket into the left bucket
		D_ASSERT(equivalence_map.find(left_equivalence_set) != equivalence_map.end());
		D_ASSERT(equivalence_map.find(right_equivalence_set) != equivalence_map.end());

		auto &left_bucket = equivalence_map.find(left_equivalence_set)->second;
		auto &right_bucket = equivalence_map.find(right_equivalence_set)->second;
		for (auto &right_expr : right_bucket) {
			// rewrite the equivalence set mapping for this node
			equivalence_set_map[right_expr] = left_equivalence_set;
			// add the node to the left bucket
			left_bucket.push_back(right_expr);
		}
		// now add all constant values from the right bucket to the left bucket
		D_ASSERT(constant_values.find(left_equivalence_set) != constant_values.end());
		D_ASSERT(constant_values.find(right_equivalence_set) != constant_values.end());
		auto &left_constant_bucket = constant_values.find(left_equivalence_set)->second;
		auto &right_constant_bucket = constant_values.find(right_equivalence_set)->second;
		for (auto &right_constant : right_constant_bucket) {
			if (AddConstantComparison(left_constant_bucket, right_constant) == FilterResult::UNSATISFIABLE) {
				return FilterResult::UNSATISFIABLE;
			}
		}
	}
	return FilterResult::SUCCESS;
}